

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O2

void __thiscall
rsg::ComputeSubRange::operator()
          (ComputeSubRange *this,Random *random,float dstMin,float dstMax,float *aMin,float *aMax,
          float *bMin,float *bMax)

{
  float fVar1;
  float fVar2;
  
  fVar1 = getQuantizedFloat(random,0.0,dstMax - dstMin,0.5);
  fVar2 = getQuantizedFloat(random,-8.0,8.0,0.5);
  *aMin = dstMin + fVar2;
  *aMax = dstMin + fVar2 + fVar1;
  *bMin = fVar2 - ((dstMax - dstMin) - fVar1);
  *bMax = fVar2;
  return;
}

Assistant:

void ComputeSubRange::operator() (de::Random& random, T dstMin, T dstMax, T& aMin, T& aMax, T& bMin, T& bMax) const
{
	struct GetRandom
	{
		int		operator() (de::Random& rnd, int min, int max) const		{ return rnd.getInt(min, max); }
		float	operator() (de::Random& rnd, float min, float max) const	{ return getQuantizedFloat(rnd, min, max, 0.5f); }
	};

	T rangeLen		= dstMax-dstMin;
	T subRangeLen	= GetRandom()(random, T(0), rangeLen);
	T aOffset		= GetRandom()(random, T(-8), T(8));

	aMin			= dstMin+aOffset;
	aMax			= aMin+subRangeLen;

	bMin			= aOffset-(rangeLen-subRangeLen);
	bMax			= aOffset;

#if defined(DE_DEBUG)
	T eps = T(0.001);
	DE_ASSERT(aMin <= aMax && bMin <= bMax);
	DE_ASSERT(de::inRange(aMin-bMin, dstMin-eps, dstMax+eps));
	DE_ASSERT(de::inRange(aMin-bMax, dstMin-eps, dstMax+eps));
	DE_ASSERT(de::inRange(aMax-bMin, dstMin-eps, dstMax+eps));
	DE_ASSERT(de::inRange(aMax-bMax, dstMin-eps, dstMax+eps));
#endif
}